

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

int uv_ip_name(sockaddr *src,char *dst,size_t size)

{
  size_t size_local;
  char *dst_local;
  sockaddr *src_local;
  
  if (src->sa_family == 2) {
    src_local._4_4_ = uv_inet_ntop(2,src->sa_data + 2,dst,size);
  }
  else if (src->sa_family == 10) {
    src_local._4_4_ = uv_inet_ntop(10,src->sa_data + 6,dst,size);
  }
  else {
    src_local._4_4_ = -0x61;
  }
  return src_local._4_4_;
}

Assistant:

int uv_ip_name(const struct sockaddr *src, char *dst, size_t size) {
  switch (src->sa_family) {
  case AF_INET:
    return uv_inet_ntop(AF_INET, &((struct sockaddr_in *)src)->sin_addr,
                        dst, size);
  case AF_INET6:
    return uv_inet_ntop(AF_INET6, &((struct sockaddr_in6 *)src)->sin6_addr,
                        dst, size);
  default:
    return UV_EAFNOSUPPORT;
  }
}